

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publickey.c
# Opt level: O0

int libssh2_publickey_add_ex
              (LIBSSH2_PUBLICKEY *pkey,uchar *name,unsigned_long name_len,uchar *blob,
              unsigned_long blob_len,char overwrite,unsigned_long num_attrs,
              libssh2_publickey_attribute *attrs)

{
  char cVar1;
  LIBSSH2_CHANNEL *channel_00;
  LIBSSH2_SESSION *session_00;
  int iVar2;
  long lVar3;
  uchar *puVar4;
  ssize_t sVar5;
  ssize_t nwritten;
  unsigned_long uStack_70;
  int rc;
  unsigned_long comment_len;
  uchar *comment;
  unsigned_long packet_len;
  unsigned_long i;
  LIBSSH2_SESSION *session;
  LIBSSH2_CHANNEL *channel;
  char overwrite_local;
  unsigned_long blob_len_local;
  uchar *blob_local;
  unsigned_long name_len_local;
  uchar *name_local;
  LIBSSH2_PUBLICKEY *pkey_local;
  
  lVar3 = name_len + 0x13 + blob_len;
  comment_len = 0;
  uStack_70 = 0;
  if (pkey == (LIBSSH2_PUBLICKEY *)0x0) {
    return -0x27;
  }
  channel_00 = pkey->channel;
  session_00 = channel_00->session;
  if (pkey->add_state == libssh2_NB_state_idle) {
    pkey->add_packet = (uchar *)0x0;
    if (pkey->version == 1) {
      for (packet_len = 0; packet_len < num_attrs; packet_len = packet_len + 1) {
        if ((attrs[packet_len].name_len == 7) &&
           (iVar2 = strncmp(attrs[packet_len].name,"comment",7), iVar2 == 0)) {
          comment_len = (unsigned_long)attrs[packet_len].value;
          uStack_70 = attrs[packet_len].value_len;
          break;
        }
      }
      comment = (uchar *)(uStack_70 + 4 + lVar3);
    }
    else {
      comment = (uchar *)(lVar3 + 5);
      for (packet_len = 0; packet_len < num_attrs; packet_len = packet_len + 1) {
        comment = comment + attrs[packet_len].name_len + 9 + attrs[packet_len].value_len;
      }
    }
    puVar4 = (uchar *)(*session_00->alloc)((size_t)comment,&session_00->abstract);
    pkey->add_packet = puVar4;
    if (pkey->add_packet == (uchar *)0x0) {
      iVar2 = _libssh2_error(session_00,-6,"Unable to allocate memory for publickey \"add\" packet")
      ;
      return iVar2;
    }
    pkey->add_s = pkey->add_packet;
    _libssh2_htonu32(pkey->add_s,(int)comment - 4);
    pkey->add_s = pkey->add_s + 4;
    _libssh2_htonu32(pkey->add_s,3);
    pkey->add_s = pkey->add_s + 4;
    puVar4 = pkey->add_s;
    puVar4[0] = 'a';
    puVar4[1] = 'd';
    puVar4[2] = 'd';
    pkey->add_s = pkey->add_s + 3;
    if (pkey->version == 1) {
      _libssh2_htonu32(pkey->add_s,(uint32_t)uStack_70);
      pkey->add_s = pkey->add_s + 4;
      if (comment_len != 0) {
        memcpy(pkey->add_s,(void *)comment_len,uStack_70);
        pkey->add_s = pkey->add_s + uStack_70;
      }
      _libssh2_htonu32(pkey->add_s,(uint32_t)name_len);
      pkey->add_s = pkey->add_s + 4;
      memcpy(pkey->add_s,name,name_len);
      pkey->add_s = pkey->add_s + name_len;
      _libssh2_htonu32(pkey->add_s,(uint32_t)blob_len);
      pkey->add_s = pkey->add_s + 4;
      memcpy(pkey->add_s,blob,blob_len);
      pkey->add_s = pkey->add_s + blob_len;
    }
    else {
      _libssh2_htonu32(pkey->add_s,(uint32_t)name_len);
      pkey->add_s = pkey->add_s + 4;
      memcpy(pkey->add_s,name,name_len);
      pkey->add_s = pkey->add_s + name_len;
      _libssh2_htonu32(pkey->add_s,(uint32_t)blob_len);
      pkey->add_s = pkey->add_s + 4;
      memcpy(pkey->add_s,blob,blob_len);
      pkey->add_s = pkey->add_s + blob_len;
      puVar4 = pkey->add_s;
      pkey->add_s = puVar4 + 1;
      *puVar4 = overwrite != '\0';
      _libssh2_htonu32(pkey->add_s,(uint32_t)num_attrs);
      pkey->add_s = pkey->add_s + 4;
      for (packet_len = 0; packet_len < num_attrs; packet_len = packet_len + 1) {
        _libssh2_htonu32(pkey->add_s,(uint32_t)attrs[packet_len].name_len);
        pkey->add_s = pkey->add_s + 4;
        memcpy(pkey->add_s,attrs[packet_len].name,attrs[packet_len].name_len);
        pkey->add_s = pkey->add_s + attrs[packet_len].name_len;
        _libssh2_htonu32(pkey->add_s,(uint32_t)attrs[packet_len].value_len);
        pkey->add_s = pkey->add_s + 4;
        memcpy(pkey->add_s,attrs[packet_len].value,attrs[packet_len].value_len);
        pkey->add_s = pkey->add_s + attrs[packet_len].value_len;
        cVar1 = attrs[packet_len].mandatory;
        puVar4 = pkey->add_s;
        pkey->add_s = puVar4 + 1;
        *puVar4 = cVar1 != '\0';
      }
    }
    pkey->add_state = libssh2_NB_state_created;
  }
  if (pkey->add_state == libssh2_NB_state_created) {
    sVar5 = _libssh2_channel_write
                      (channel_00,0,pkey->add_packet,(long)pkey->add_s - (long)pkey->add_packet);
    if (sVar5 == -0x25) {
      return -0x25;
    }
    if ((long)pkey->add_s - (long)pkey->add_packet != sVar5) {
      (*session_00->free)(pkey->add_packet,&session_00->abstract);
      pkey->add_packet = (uchar *)0x0;
      iVar2 = _libssh2_error(session_00,-7,"Unable to send publickey add packet");
      return iVar2;
    }
    (*session_00->free)(pkey->add_packet,&session_00->abstract);
    pkey->add_packet = (uchar *)0x0;
    pkey->add_state = libssh2_NB_state_sent;
  }
  iVar2 = publickey_response_success(pkey);
  if (iVar2 != -0x25) {
    pkey->add_state = libssh2_NB_state_idle;
  }
  return iVar2;
}

Assistant:

LIBSSH2_API int
libssh2_publickey_add_ex(LIBSSH2_PUBLICKEY *pkey, const unsigned char *name,
                         unsigned long name_len, const unsigned char *blob,
                         unsigned long blob_len, char overwrite,
                         unsigned long num_attrs,
                         const libssh2_publickey_attribute attrs[])
{
    LIBSSH2_CHANNEL *channel;
    LIBSSH2_SESSION *session;
    /*  19 = packet_len(4) + add_len(4) + "add"(3) + name_len(4) + {name}
        blob_len(4) + {blob} */
    unsigned long i, packet_len = 19 + name_len + blob_len;
    unsigned char *comment = NULL;
    unsigned long comment_len = 0;
    int rc;

    if(!pkey)
        return LIBSSH2_ERROR_BAD_USE;

    channel = pkey->channel;
    session = channel->session;

    if(pkey->add_state == libssh2_NB_state_idle) {
        pkey->add_packet = NULL;

        _libssh2_debug((session, LIBSSH2_TRACE_PUBLICKEY,
                       "Adding %s publickey", name));

        if(pkey->version == 1) {
            for(i = 0; i < num_attrs; i++) {
                /* Search for a comment attribute */
                if(attrs[i].name_len == (sizeof("comment") - 1) &&
                    strncmp(attrs[i].name, "comment",
                            sizeof("comment") - 1) == 0) {
                    comment = (unsigned char *) attrs[i].value;
                    comment_len = attrs[i].value_len;
                    break;
                }
            }
            packet_len += 4 + comment_len;
        }
        else {
            packet_len += 5;    /* overwrite(1) + attribute_count(4) */
            for(i = 0; i < num_attrs; i++) {
                packet_len += 9 + attrs[i].name_len + attrs[i].value_len;
                /* name_len(4) + value_len(4) + mandatory(1) */
            }
        }

        pkey->add_packet = LIBSSH2_ALLOC(session, packet_len);
        if(!pkey->add_packet) {
            return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                  "Unable to allocate memory for "
                                  "publickey \"add\" packet");
        }

        pkey->add_s = pkey->add_packet;
        _libssh2_htonu32(pkey->add_s, (uint32_t)(packet_len - 4));
        pkey->add_s += 4;
        _libssh2_htonu32(pkey->add_s, sizeof("add") - 1);
        pkey->add_s += 4;
        memcpy(pkey->add_s, "add", sizeof("add") - 1);
        pkey->add_s += sizeof("add") - 1;
        if(pkey->version == 1) {
            _libssh2_htonu32(pkey->add_s, (uint32_t)comment_len);
            pkey->add_s += 4;
            if(comment) {
                memcpy(pkey->add_s, comment, comment_len);
                pkey->add_s += comment_len;
            }

            _libssh2_htonu32(pkey->add_s, (uint32_t)name_len);
            pkey->add_s += 4;
            memcpy(pkey->add_s, name, name_len);
            pkey->add_s += name_len;
            _libssh2_htonu32(pkey->add_s, (uint32_t)blob_len);
            pkey->add_s += 4;
            memcpy(pkey->add_s, blob, blob_len);
            pkey->add_s += blob_len;
        }
        else {
            /* Version == 2 */

            _libssh2_htonu32(pkey->add_s, (uint32_t)name_len);
            pkey->add_s += 4;
            memcpy(pkey->add_s, name, name_len);
            pkey->add_s += name_len;
            _libssh2_htonu32(pkey->add_s, (uint32_t)blob_len);
            pkey->add_s += 4;
            memcpy(pkey->add_s, blob, blob_len);
            pkey->add_s += blob_len;
            *(pkey->add_s++) = overwrite ? 0x01 : 0;
            _libssh2_htonu32(pkey->add_s, (uint32_t)num_attrs);
            pkey->add_s += 4;
            for(i = 0; i < num_attrs; i++) {
                _libssh2_htonu32(pkey->add_s, (uint32_t)attrs[i].name_len);
                pkey->add_s += 4;
                memcpy(pkey->add_s, attrs[i].name, attrs[i].name_len);
                pkey->add_s += attrs[i].name_len;
                _libssh2_htonu32(pkey->add_s, (uint32_t)attrs[i].value_len);
                pkey->add_s += 4;
                memcpy(pkey->add_s, attrs[i].value, attrs[i].value_len);
                pkey->add_s += attrs[i].value_len;
                *(pkey->add_s++) = attrs[i].mandatory ? 0x01 : 0;
            }
        }

        _libssh2_debug((session, LIBSSH2_TRACE_PUBLICKEY,
                       "Sending publickey \"add\" packet: "
                       "type=%s blob_len=%ld num_attrs=%ld",
                       name, blob_len, num_attrs));

        pkey->add_state = libssh2_NB_state_created;
    }

    if(pkey->add_state == libssh2_NB_state_created) {
        ssize_t nwritten;
        nwritten = _libssh2_channel_write(channel, 0, pkey->add_packet,
                                          (pkey->add_s - pkey->add_packet));
        if(nwritten == LIBSSH2_ERROR_EAGAIN) {
            return (int)nwritten;
        }
        else if((pkey->add_s - pkey->add_packet) != nwritten) {
            LIBSSH2_FREE(session, pkey->add_packet);
            pkey->add_packet = NULL;
            return _libssh2_error(session, LIBSSH2_ERROR_SOCKET_SEND,
                                  "Unable to send publickey add packet");
        }
        LIBSSH2_FREE(session, pkey->add_packet);
        pkey->add_packet = NULL;

        pkey->add_state = libssh2_NB_state_sent;
    }

    rc = publickey_response_success(pkey);
    if(rc == LIBSSH2_ERROR_EAGAIN) {
        return rc;
    }

    pkey->add_state = libssh2_NB_state_idle;

    return rc;
}